

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimistic_lock.hpp
# Opt level: O0

read_critical_section __thiscall unodb::optimistic_lock::try_read_lock(optimistic_lock *this)

{
  bool bVar1;
  version_tag_type extraout_RDX;
  version_tag_type extraout_RDX_00;
  version_type vVar2;
  optimistic_lock *in_RSI;
  read_critical_section rVar3;
  version_type local_28;
  version_type current_version;
  optimistic_lock *this_local;
  
  do {
    local_28 = atomic_version_type::load_acquire(&in_RSI->version);
    bVar1 = version_type::is_free(&local_28);
    if (bVar1) {
      inc_read_lock_count(in_RSI);
      read_critical_section::read_critical_section((read_critical_section *)this,in_RSI,local_28);
      vVar2.version = extraout_RDX;
LAB_001eb54c:
      rVar3.version.version = vVar2.version;
      rVar3.lock = this;
      return rVar3;
    }
    if (local_28.version == 1) {
      memset(this,0,0x10);
      read_critical_section::read_critical_section((read_critical_section *)this);
      vVar2.version = extraout_RDX_00;
      goto LAB_001eb54c;
    }
    bVar1 = version_type::is_write_locked(&local_28);
    if (!bVar1) {
      __assert_fail("current_version.is_write_locked()",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                    ,0x2b7,"read_critical_section unodb::optimistic_lock::try_read_lock()");
    }
    spin_wait_loop_body();
  } while( true );
}

Assistant:

[[nodiscard]] read_critical_section try_read_lock() noexcept {
    while (true) {
      const auto current_version = version.load_acquire();
      if (UNODB_DETAIL_LIKELY(current_version.is_free())) {
        inc_read_lock_count();
        return read_critical_section{*this, current_version};
      }
      // LCOV_EXCL_START
      if (UNODB_DETAIL_UNLIKELY(current_version.is_obsolete()))
        return read_critical_section{};
      UNODB_DETAIL_ASSERT(current_version.is_write_locked());
      spin_wait_loop_body();
      // LCOV_EXCL_STOP
    }
  }